

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactory.cpp
# Opt level: O0

unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_> __thiscall
ApprovalTests::ReporterFactory::createReporter(ReporterFactory *this,string *reporterName)

{
  ulong uVar1;
  key_type *in_RSI;
  tuple<ApprovalTests::Reporter_*,_std::default_delete<ApprovalTests::Reporter>_> in_RDI;
  string key;
  string osPrefix;
  string *in_stack_00000228;
  string *in_stack_00000230;
  ReporterFactory *in_stack_00000238;
  unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>
  *in_stack_ffffffffffffff70;
  _Head_base<0UL,_ApprovalTests::Reporter_*,_false> this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  *this_01;
  string local_58 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  local_38;
  
  this_01 = &local_38;
  this_00._M_head_impl =
       (Reporter *)
       in_RDI.
       super__Tuple_impl<0UL,_ApprovalTests::Reporter_*,_std::default_delete<ApprovalTests::Reporter>_>
       .super__Head_base<0UL,_ApprovalTests::Reporter_*,_false>._M_head_impl;
  getOsPrefix_abi_cxx11_();
  findReporterName(in_stack_00000238,in_stack_00000230,in_stack_00000228);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
    ::at(this_01,in_RSI);
    ::std::
    function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>
    ::operator()((function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>
                  *)this_00._M_head_impl);
  }
  else {
    ::std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>::
    unique_ptr<std::default_delete<ApprovalTests::Reporter>,void>(in_stack_ffffffffffffff70);
  }
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return (__uniq_ptr_data<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>,_true,_true>
          )(__uniq_ptr_data<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_ApprovalTests::Reporter_*,_std::default_delete<ApprovalTests::Reporter>_>
             .super__Head_base<0UL,_ApprovalTests::Reporter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Reporter>
    ReporterFactory::createReporter(const std::string& reporterName) const
    {
        auto osPrefix = getOsPrefix();

        auto key = findReporterName(osPrefix, reporterName);

        if (!key.empty())
        {
            return map.at(key)();
        }

        return std::unique_ptr<Reporter>();
    }